

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void __thiscall FSlide::HitSlideLine(FSlide *this,line_t *ld)

{
  DVector2 *pDVar1;
  FDisplacement *pFVar2;
  double dVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  FSoundID *sound_id;
  AActor *pAVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  DVector2 DVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  FSoundID local_84;
  FSoundID local_80;
  FSoundID local_7c;
  double local_78;
  double dStack_70;
  divline_t local_68;
  divline_t local_48;
  
  dVar9 = (this->tmmove).X;
  dVar10 = (this->tmmove).Y;
  if (((dVar10 * dVar10 + dVar9 * dVar9 <= 16.0) || (!var_friction.Value)) ||
     (pAVar7 = this->slidemo, pAVar7->floorz < (pAVar7->__Pos).Z)) {
    bVar5 = false;
  }
  else {
    dVar9 = P_GetFriction(pAVar7,(double *)0x0);
    bVar5 = 0.90625 < dVar9;
  }
  pDVar1 = &this->tmmove;
  dVar9 = (ld->delta).X;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    dVar10 = (ld->delta).Y;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      pAVar7 = this->slidemo;
      iVar6 = pAVar7->Sector->PortalGroup;
      iVar4 = ld->frontsector->PortalGroup;
      uVar15 = 0;
      uVar16 = 0;
      uVar17 = 0;
      uVar18 = 0;
      if (iVar6 != iVar4) {
        pFVar2 = Displacements.data.Array + (iVar4 * Displacements.size + iVar6);
        uVar15 = *(undefined4 *)&(pFVar2->pos).X;
        uVar16 = *(undefined4 *)((long)&(pFVar2->pos).X + 4);
        uVar17 = *(undefined4 *)&(pFVar2->pos).Y;
        uVar18 = *(undefined4 *)((long)&(pFVar2->pos).Y + 4);
      }
      local_78 = (pAVar7->__Pos).X + (double)CONCAT44(uVar16,uVar15);
      dStack_70 = (pAVar7->__Pos).Y + (double)CONCAT44(uVar18,uVar17);
      if (((byte)i_compatflags2 & 8) == 0) {
        bVar8 = 1.52587890625e-05 <
                ((ld->v1->p).X - local_78) * dVar10 + (dStack_70 - (ld->v1->p).Y) * dVar9;
      }
      else {
        iVar6 = P_VanillaPointOnLineSide(local_78,dStack_70,ld);
        bVar8 = iVar6 == 1;
        dVar9 = (ld->delta).X;
        dVar10 = (ld->delta).Y;
      }
      dVar9 = c_atan2(dVar10,dVar9);
      dVar9 = dVar9 * 57.29577951308232;
      if (bVar8) {
        dVar9 = dVar9 + 180.0;
      }
      dVar10 = c_atan2((this->tmmove).Y,(this->tmmove).X);
      dVar11 = (double)SUB84(((dVar10 * 57.29577951308232 + 3600.0) - dVar9) * 11930464.711111112 +
                             6755399441055744.0,0) * 8.381903171539307e-08;
      dVar10 = (this->tmmove).X;
      dVar3 = (this->tmmove).Y;
      dVar10 = c_sqrt(dVar3 * dVar3 + dVar10 * dVar10);
      if ((bool)(bVar5 & (45.0 < dVar11 && dVar11 < 135.0))) {
        local_68.x = (double)SUB84((dVar9 - dVar11) * 11930464.711111112 + 6755399441055744.0,0) *
                     8.381903171539307e-08;
        pAVar7 = this->slidemo;
        if (((pAVar7->player != (player_t *)0x0) && (0 < pAVar7->health)) &&
           ((pAVar7->player->cheats & 0x2000) == 0)) {
          local_84.ID = S_FindSound("*grunt");
          S_Sound(pAVar7,2,&local_84,1.0,1.001);
        }
        TAngle<double>::ToVector((TAngle<double> *)&local_48,dVar10 * 0.5);
        pDVar1->X = local_48.x;
        (this->tmmove).Y = local_48.y;
        return;
      }
      local_48.x = (ld->v1->p).X;
      local_48.y = (ld->v1->p).Y;
      local_48.dx = (ld->delta).X;
      local_68.dx = (ld->delta).Y;
      local_68.x = local_78;
      local_68.y = dStack_70;
      local_68.dy = -local_48.dx;
      local_48.dy = local_68.dx;
      dVar9 = P_InterceptVector(&local_48,&local_68);
      local_68.dx = pDVar1->X;
      local_68.dy = (this->tmmove).Y;
      dVar10 = P_InterceptVector(&local_48,&local_68);
      auVar12._0_8_ = P_InterceptVector(&local_68,&local_48);
      if ((auVar12._0_8_ == 0.0) && (!NAN(auVar12._0_8_))) {
        pDVar1->X = 0.0;
        (this->tmmove).Y = 0.0;
        return;
      }
      auVar13._0_8_ = (dVar10 - dVar9) * local_48.dx;
      auVar13._8_8_ = (dVar10 - dVar9) * local_48.dy;
      auVar12._8_8_ = auVar12._0_8_;
      DVar14 = (DVector2)divpd(auVar13,auVar12);
      *pDVar1 = DVar14;
      return;
    }
    if (bVar5) {
      dVar9 = (this->tmmove).Y;
      if (ABS(pDVar1->X) < ABS(dVar9)) {
        (this->tmmove).X = pDVar1->X * 0.5;
        (this->tmmove).Y = dVar9 * -0.5;
        pAVar7 = this->slidemo;
        if (pAVar7->player == (player_t *)0x0) {
          return;
        }
        if (pAVar7->health < 1) {
          return;
        }
        if ((pAVar7->player->cheats & 0x2000) != 0) {
          return;
        }
        iVar6 = S_FindSound("*grunt");
        sound_id = &local_80;
        goto LAB_0053d95b;
      }
    }
    (this->tmmove).Y = 0.0;
  }
  else {
    if (bVar5) {
      dVar9 = (this->tmmove).Y;
      if (ABS(dVar9) < ABS(pDVar1->X)) {
        (this->tmmove).X = pDVar1->X * -0.5;
        (this->tmmove).Y = dVar9 * 0.5;
        pAVar7 = this->slidemo;
        if (pAVar7->player == (player_t *)0x0) {
          return;
        }
        if (pAVar7->health < 1) {
          return;
        }
        if ((pAVar7->player->cheats & 0x2000) != 0) {
          return;
        }
        iVar6 = S_FindSound("*grunt");
        sound_id = &local_7c;
LAB_0053d95b:
        sound_id->ID = iVar6;
        S_Sound(pAVar7,2,sound_id,1.0,1.001);
        return;
      }
    }
    pDVar1->X = 0.0;
  }
  return;
}

Assistant:

void FSlide::HitSlideLine(line_t* ld)
{
	int 	side;

	DAngle lineangle;
	DAngle moveangle;
	DAngle deltaangle;

	double movelen;
	bool	icyfloor;	// is floor icy?							// phares
	//   |
	// Under icy conditions, if the angle of approach to the wall	//   V
	// is more than 45 degrees, then you'll bounce and lose half
	// your velocity. If less than 45 degrees, you'll slide along
	// the wall. 45 is arbitrary and is believable.

	// Check for the special cases of horz or vert walls.

	// killough 10/98: only bounce if hit hard (prevents wobbling)
	icyfloor =
		tmmove.LengthSquared() > 4*4 &&
		var_friction &&  // killough 8/28/98: calc friction on demand
		slidemo->Z() <= slidemo->floorz &&
		P_GetFriction(slidemo, NULL) > ORIG_FRICTION;

	if (ld->Delta().X == 0)
	{ // ST_VERTICAL
		if (icyfloor && (fabs(tmmove.X) > fabs(tmmove.Y)))
		{
			tmmove.X = -tmmove.X / 2;
			tmmove.Y /= 2; // absorb half the velocity
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!//   ^
			}
		}																		//   |
		else																	// phares
			tmmove.X = 0; // no more movement in the X direction
		return;
	}

	if (ld->Delta().Y == 0)
	{ // ST_HORIZONTAL
		if (icyfloor && (fabs(tmmove.Y) > fabs(tmmove.X)))
		{
			tmmove.X /= 2; // absorb half the velocity
			tmmove.Y = -tmmove.Y / 2;
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
			}
		}
		else
			tmmove.Y = 0; // no more movement in the Y direction
		return;
	}

	// The wall is angled. Bounce if the angle of approach is		// phares
	// less than 45 degrees.										// phares

	DVector3 pos = slidemo->PosRelative(ld);
	side = P_PointOnLineSide(pos, ld);

	lineangle = ld->Delta().Angle();

	if (side == 1)
		lineangle += 180.;

	moveangle = tmmove.Angle();

	// prevents sudden path reversal due to rounding error |	// phares
	moveangle += 3600/65536.*65536.;		// Boom added 10 to the angle here.
	
	deltaangle = ::deltaangle(lineangle, moveangle);								//   V
	movelen = tmmove.Length();
	if (icyfloor && (deltaangle > 45) && (deltaangle < 135))
	{
		moveangle = ::deltaangle(deltaangle, lineangle);
		movelen /= 2; // absorb
		if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
		{
			S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
		}
		tmmove = moveangle.ToVector(movelen);
	}	
	else
	{	
		// The compatibility option that used to be here had to be removed because
		// with floating point math it was no longer possible to reproduce.

#if 0
		// with full precision this should work now. Needs some testing
		if (deltaangle < 0)	deltaangle += 180.;
		tmmove = lineangle.ToVector(movelen * deltaangle.Cos());
#else
		divline_t dll, dlv;
		double inter1, inter2, inter3;

		P_MakeDivline(ld, &dll);

		dlv.x = pos.X;
		dlv.y = pos.Y;
		dlv.dx = dll.dy;
		dlv.dy = -dll.dx;

		inter1 = P_InterceptVector(&dll, &dlv);

		dlv.dx = tmmove.X;
		dlv.dy = tmmove.Y;
		inter2 = P_InterceptVector(&dll, &dlv);
		inter3 = P_InterceptVector(&dlv, &dll);

		if (inter3 != 0)
		{
			tmmove.X = (inter2 - inter1) * dll.dx / inter3;
			tmmove.Y = (inter2 - inter1) * dll.dy / inter3;
		}
		else
		{
			tmmove.Zero();
		}
#endif
	}																// phares
}